

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

unique_ptr<vm::VM,_std::default_delete<vm::VM>_> __thiscall vm::VM::make_vm(VM *this,File *file)

{
  pointer *ppIVar1;
  ushort uVar2;
  pointer pFVar3;
  pointer pCVar4;
  int *piVar5;
  _Head_base<0UL,_vm::VM_*,_false> _Var6;
  int iVar7;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar8;
  VM *this_00;
  int *piVar9;
  undefined8 *puVar10;
  ulong uVar11;
  uint uVar12;
  iterator iVar13;
  pointer pFVar14;
  __single_object vm;
  _Head_base<0UL,_vm::VM_*,_false> local_f0;
  uint *local_e8;
  undefined8 local_e0;
  uint local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  uint *local_c8;
  undefined8 local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint *local_a8;
  undefined8 local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  _Head_base<0UL,_vm::VM_*,_false> local_88;
  File local_80;
  
  pFVar14 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar12 = 0;
  local_88._M_head_impl = this;
  do {
    if (pFVar14 == pFVar3) {
LAB_00117297:
      pFVar14 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pFVar3 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((long)pFVar3 - (long)pFVar14 >> 5 != (ulong)uVar12) {
        this_00 = (VM *)operator_new(0xf8);
        local_80.version = file->version;
        local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
        .super__Vector_impl_data._M_start =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
        .super__Vector_impl_data._M_finish =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = pFVar14;
        local_80.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_finish = pFVar3;
        VM(this_00,&local_80);
        local_f0._M_head_impl = this_00;
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_80.functions);
        if (local_80.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.start.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.start.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.start.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_80.constants);
        piVar9 = (int *)operator_new__(0x3fffffc);
        memset(piVar9,0,0x3fffffc);
        piVar5 = (this_00->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                 .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        (this_00->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar9;
        if (piVar5 != (int *)0x0) {
          operator_delete__(piVar5);
        }
        piVar9 = (int *)operator_new__(0x3fffffc);
        memset(piVar9,0,0x3fffffc);
        piVar5 = ((local_f0._M_head_impl)->_heap)._M_t.
                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        ((local_f0._M_head_impl)->_heap)._M_t.
        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar9;
        if (piVar5 != (int *)0x0) {
          operator_delete__(piVar5);
        }
        _Var6._M_head_impl = local_88._M_head_impl;
        *(VM **)local_88._M_head_impl = local_f0._M_head_impl;
        local_f0._M_head_impl = (VM *)0x0;
        std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
                  ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)&local_f0);
        return (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)
               (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)_Var6._M_head_impl;
      }
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"main not found","");
      *puVar10 = &PTR__InvalidFile_001247e8;
      puVar10[1] = puVar10 + 3;
      if (local_e8 == &local_d8) {
        *(uint *)(puVar10 + 3) = local_d8;
        *(undefined4 *)((long)puVar10 + 0x1c) = uStack_d4;
        *(undefined4 *)(puVar10 + 4) = uStack_d0;
        *(undefined4 *)((long)puVar10 + 0x24) = uStack_cc;
      }
      else {
        puVar10[1] = local_e8;
        puVar10[3] = CONCAT44(uStack_d4,local_d8);
      }
      puVar10[2] = local_e0;
      local_e0 = 0;
      local_d8 = local_d8 & 0xffffff00;
      local_e8 = &local_d8;
      __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    uVar2 = pFVar14->nameIndex;
    pCVar4 = (file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(file->constants).
                    super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pCVar4 >> 4) * -0x5555555555555555;
    if (uVar11 < uVar2 || uVar11 - uVar2 == 0) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_a8 = &local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"function name index out of range","");
      *puVar10 = &PTR__InvalidFile_001247e8;
      puVar10[1] = puVar10 + 3;
      if (local_a8 == &local_98) {
        *(uint *)(puVar10 + 3) = local_98;
        *(undefined4 *)((long)puVar10 + 0x1c) = uStack_94;
        *(undefined4 *)(puVar10 + 4) = uStack_90;
        *(undefined4 *)((long)puVar10 + 0x24) = uStack_8c;
      }
      else {
        puVar10[1] = local_a8;
        puVar10[3] = CONCAT44(uStack_94,local_98);
      }
      puVar10[2] = local_a0;
      local_a0 = 0;
      local_98 = local_98 & 0xffffff00;
      local_a8 = &local_98;
      __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    if ((&pCVar4->type)[(uint)uVar2 * 0x30] != STRING) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"function name not found","");
      *puVar10 = &PTR__InvalidFile_001247e8;
      puVar10[1] = puVar10 + 3;
      if (local_c8 == &local_b8) {
        *(uint *)(puVar10 + 3) = local_b8;
        *(undefined4 *)((long)puVar10 + 0x1c) = uStack_b4;
        *(undefined4 *)(puVar10 + 4) = uStack_b0;
        *(undefined4 *)((long)puVar10 + 0x24) = uStack_ac;
      }
      else {
        puVar10[1] = local_c8;
        puVar10[3] = CONCAT44(uStack_b4,local_b8);
      }
      puVar10[2] = local_c0;
      local_c0 = 0;
      local_b8 = local_b8 & 0xffffff00;
      local_c8 = &local_b8;
      __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    pvVar8 = std::get<0ul,std::__cxx11::string,int,double>
                       ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                         *)((long)&(pCVar4->value).
                                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                   .
                                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                           + (ulong)((uint)uVar2 * 0x30)));
    iVar7 = std::__cxx11::string::compare((char *)pvVar8);
    if (iVar7 == 0) {
      local_80.version = CONCAT31(local_80.version._1_3_,0xc);
      uVar2 = pFVar14->paramSize;
      local_80._4_4_ = ZEXT24(uVar2);
      local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)local_80.constants.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
      iVar13._M_current =
           (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
        _M_realloc_insert<vm::Instruction>(&file->start,iVar13,(Instruction *)&local_80);
        iVar13._M_current =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar13._M_current)->y = 0;
        uVar11 = (ulong)CONCAT24(uVar2,local_80.version);
        (iVar13._M_current)->op = (char)uVar11;
        *(int3 *)&(iVar13._M_current)->field_0x1 = (int3)(uVar11 >> 8);
        (iVar13._M_current)->x = (int)(uVar11 >> 0x20);
        iVar13._M_current =
             (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
        (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current;
      }
      local_80.version = CONCAT31(local_80.version._1_3_,0x80);
      local_80.constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)local_80.constants.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_80._4_4_ = uVar12;
      if (iVar13._M_current ==
          (file->start).super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
        _M_realloc_insert<vm::Instruction>(&file->start,iVar13,(Instruction *)&local_80);
      }
      else {
        (iVar13._M_current)->y = 0;
        (iVar13._M_current)->op = 0x80;
        *(undefined3 *)&(iVar13._M_current)->field_0x1 = local_80.version._1_3_;
        (iVar13._M_current)->x = uVar12;
        ppIVar1 = &(file->start).
                   super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      goto LAB_00117297;
    }
    uVar12 = uVar12 + 1;
    pFVar14 = pFVar14 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<VM> VM::make_vm(File file) {
    // found main function
    vm::u4 mainIndex = 0;
    bool mainFound = false;
    for (auto& fun : file.functions) {
        if (0 > fun.nameIndex || fun.nameIndex >= file.constants.size()) {
            throw InvalidFile("function name index out of range");
        }
        if (auto& constant = file.constants.at(fun.nameIndex); constant.type == vm::Constant::Type::STRING) {
            if (std::get<vm::str_t>(constant.value) == "main") {
                file.start.push_back(Instruction{OpCode::snew, fun.paramSize});
                file.start.push_back(Instruction{OpCode::call, mainIndex});
                break;
            }
        }
        else {
            throw InvalidFile("function name not found");
        }
        ++mainIndex;
    }
    if (mainIndex == file.functions.size()) {
        throw InvalidFile("main not found");
    }
    auto vm = std::make_unique<VM>(std::move(file));
    vm->_stack = std::make_unique<slot_t[]>(MAX_STACK_ADDR-MIN_STACK_ADDR);
    vm->_heap  = std::make_unique<slot_t[]>(MAX_HEAP_ADDR-MIN_HEAP_ADDR);
    return std::move(vm);
}